

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  byte c;
  ulong uVar1;
  char *pcVar2;
  iterator iVar3;
  char c_00;
  TokenType TVar4;
  Result RVar5;
  char *pcVar6;
  char *pcVar7;
  Token *pTVar8;
  uint uVar9;
  undefined8 this_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar10;
  uint32_t lo;
  TextVector texts;
  uint32_t digit;
  undefined1 local_b1 [9];
  char *pcStack_a8;
  undefined8 local_a0;
  basic_string_view<char,_std::char_traits<char>_> *local_98;
  iterator iStack_90;
  undefined8 local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  Token local_70;
  
  local_98 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  iStack_90._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_88 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  TVar4 = Peek(this,0);
  if (TVar4 == Text) {
    local_a0 = out_data;
    do {
      Consume(&local_70,this);
      if (5 < local_70.token_type_ - AlignEqNat) {
        __assert_fail("HasText()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                      ,99,"std::string_view wabt::Token::text() const");
      }
      local_b1._1_8_ = local_70.field_2.text_._M_len;
      pcStack_a8 = local_70.field_2.text_._M_str;
      if (iStack_90._M_current == (basic_string_view<char,_std::char_traits<char>_> *)local_88) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_98,iStack_90,
                   (basic_string_view<char,_std::char_traits<char>_> *)(local_b1 + 1));
      }
      else {
        (iStack_90._M_current)->_M_len = local_70.field_2.text_._M_len;
        (iStack_90._M_current)->_M_str = local_70.field_2.text_._M_str;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      TVar4 = Peek(this,0);
    } while (TVar4 == Text);
    local_78 = iStack_90._M_current;
    if (local_98 != iStack_90._M_current) {
      this_00 = local_a0;
      pbVar10 = local_98;
      do {
        uVar1 = pbVar10->_M_len;
        if (2 < uVar1) {
          pcVar2 = pbVar10->_M_str;
          pcVar6 = pcVar2;
joined_r0x00180071:
          pcVar7 = pcVar6 + 1;
          if (pcVar2 + (uVar1 - 1) <= pcVar7) goto LAB_00180274;
          local_70.loc.filename._M_len._1_3_ = (undefined3)((uint)local_70.loc.filename._M_len >> 8)
          ;
          if (*pcVar7 != '\\') {
            local_70.loc.filename._M_len._0_4_ =
                 CONCAT31(local_70.loc.filename._M_len._1_3_,*pcVar7);
            pTVar8 = &local_70;
LAB_001800bc:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                       (uchar *)pTVar8);
            pcVar6 = pcVar7;
            goto joined_r0x00180071;
          }
          pcVar6 = pcVar7 + 1;
          c = pcVar7[1];
          pTVar8 = &local_70;
          if (c < 0x6e) {
            if (c == 0x22) {
              local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,0x22)
              ;
            }
            else if (c == 0x27) {
              local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,0x27)
              ;
            }
            else {
              if (c != 0x5c) goto switchD_001800a6_caseD_6f;
              local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,0x5c)
              ;
            }
            goto LAB_00180169;
          }
          switch(c) {
          case 0x6e:
            local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,10);
            break;
          default:
switchD_001800a6_caseD_6f:
            RVar5 = ParseHexdigit(c,(uint32_t *)&local_70);
            if ((RVar5.enum_ != Ok) ||
               (RVar5 = ParseHexdigit(pcVar7[2],(uint32_t *)(local_b1 + 1)), RVar5.enum_ != Ok)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                            ,0x83,
                            "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                           );
            }
            pcVar7 = pcVar7 + 2;
            local_b1[0] = (byte)((uint)local_70.loc.filename._M_len << 4) | (byte)local_b1._1_8_;
            pTVar8 = (Token *)local_b1;
            goto LAB_001800bc;
          case 0x72:
            local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,0xd);
            break;
          case 0x74:
            local_70.loc.filename._M_len._0_4_ = CONCAT31(local_70.loc.filename._M_len._1_3_,9);
            break;
          case 0x75:
            c_00 = pcVar7[3];
            pcVar6 = pcVar7 + 3;
            uVar9 = 0;
            do {
              RVar5 = ParseHexdigit(c_00,(uint32_t *)&local_70);
              this_00 = local_a0;
              if (RVar5.enum_ != Ok) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                              ,0x5b,
                              "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                             );
              }
              uVar9 = uVar9 << 4 | (uint)local_70.loc.filename._M_len;
              c_00 = pcVar6[1];
              pcVar6 = pcVar6 + 1;
            } while (c_00 != '}');
            if (0x10ffff < uVar9) {
              __assert_fail("scalar_value < 0x110000",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                            ,0x61,
                            "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                           );
            }
            if (uVar9 < 0x80) {
              local_b1[1] = (char)uVar9;
              pTVar8 = (Token *)(local_b1 + 1);
              break;
            }
            if (uVar9 < 0x800) {
              local_b1._1_8_ = CONCAT71(local_b1._2_7_,(char)(uVar9 >> 6)) | 0xc0;
            }
            else {
              if (uVar9 < 0x10000) {
                local_b1._1_8_ = CONCAT71(local_b1._2_7_,(char)(uVar9 >> 0xc)) | 0xe0;
              }
              else {
                local_b1._1_8_ = CONCAT71(local_b1._2_7_,(char)(uVar9 >> 0x12)) | 0xf0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                           (uchar *)(local_b1 + 1));
                local_b1._1_8_ =
                     CONCAT71(local_b1._2_7_,(char)(uVar9 >> 0xc)) & 0xffffffffffffff3f | 0x80;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                         local_b1 + 1);
              local_b1._1_8_ =
                   CONCAT71(local_b1._2_7_,(char)(uVar9 >> 6)) & 0xffffffffffffff3f | 0x80;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,local_b1 + 1
                      );
            local_b1._1_8_ = CONCAT71(local_b1._2_7_,(char)uVar9) & 0xffffffffffffff3f | 0x80;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,local_b1 + 1
                      );
            goto joined_r0x00180071;
          }
LAB_00180169:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                     (uchar *)pTVar8);
          goto joined_r0x00180071;
        }
LAB_00180274:
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_78);
    }
    iVar3._M_current = iStack_90._M_current;
    pbVar10 = local_98;
    if (local_98 != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
      iStack_90._M_current = iVar3._M_current;
      goto LAB_001802ac;
    }
  }
  pbVar10 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_001802ac:
  return pbVar10 != iStack_90._M_current;
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}